

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O1

ssize_t __thiscall
Text::splice(Text *this,int __fdin,__off64_t *__offin,int __fdout,__off64_t *__offout,size_t __len,
            uint __flags)

{
  uint uVar1;
  size_type sVar2;
  long lVar3;
  pointer puVar4;
  size_type sVar5;
  Point PVar6;
  const_iterator inserted_begin;
  const_iterator inserted_end;
  size_t sVar7;
  pointer puVar8;
  ulong uVar9;
  uint32_t splice_start;
  uint in_register_00000034;
  uint uVar10;
  ClipResult CVar11;
  undefined4 in_stack_0000000c;
  uint in_stack_00000010;
  uint in_stack_00000018;
  int local_48;
  Point local_40;
  Point local_38;
  
  local_40.column = in_register_00000034;
  local_40.row = __fdin;
  local_38 = (Point)__offin;
  CVar11 = clip_position(this,local_40);
  splice_start = CVar11.offset;
  PVar6 = Point::traverse(&local_40,&local_38);
  CVar11 = clip_position(this,PVar6);
  sVar2 = (this->content)._M_string_length;
  inserted_begin = TextSlice::begin_abi_cxx11_((TextSlice *)&__flags);
  inserted_end = TextSlice::end_abi_cxx11_((TextSlice *)&__flags);
  splice_vector<std::__cxx11::u16string>
            (&this->content,splice_start,CVar11.offset - splice_start,
             (const_iterator)inserted_begin._M_current,(const_iterator)inserted_end._M_current);
  lVar3 = *(long *)(CONCAT44(in_stack_0000000c,__flags) + 0x20);
  splice_vector<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (&this->line_offsets,local_40.row + 1,local_38.row,
             (uint *)(lVar3 + 4 + (ulong)in_stack_00000010 * 4),
             (uint *)(lVar3 + (ulong)in_stack_00000018 * 4 + 4));
  uVar10 = local_40.row;
  uVar1 = local_40.row + 1;
  PVar6 = TextSlice::extent((TextSlice *)&__flags);
  uVar10 = uVar10 + PVar6.row + 1;
  sVar7 = TextSlice::start_offset((TextSlice *)&__flags);
  if (uVar1 < uVar10) {
    uVar9 = (ulong)uVar1;
    puVar4 = (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      puVar8 = puVar4 + uVar9;
      *puVar8 = *puVar8 + (splice_start - (int)sVar7);
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar9);
  }
  puVar8 = (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + uVar10;
  puVar4 = (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 != puVar4) {
    sVar5 = (this->content)._M_string_length;
    local_48 = (int)sVar2;
    do {
      *puVar8 = *puVar8 + ((int)sVar5 - local_48);
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar4);
  }
  return (ssize_t)puVar8;
}

Assistant:

void Text::splice(Point start, Point deletion_extent, TextSlice inserted_slice) {
  uint32_t content_splice_start = offset_for_position(start);
  uint32_t content_splice_end = offset_for_position(start.traverse(deletion_extent));
  uint32_t original_content_size = content.size();
  splice_vector(
    content,
    content_splice_start,
    content_splice_end - content_splice_start,
    inserted_slice.begin(),
    inserted_slice.end()
  );

  splice_vector(
    line_offsets,
    start.row + 1,
    deletion_extent.row,
    inserted_slice.text->line_offsets.begin() + inserted_slice.start_position.row + 1,
    inserted_slice.text->line_offsets.begin() + inserted_slice.end_position.row + 1
  );

  uint32_t inserted_newlines_start = start.row + 1;
  uint32_t inserted_newlines_end = start.row + inserted_slice.extent().row + 1;
  int64_t inserted_line_offsets_delta = content_splice_start - static_cast<int64_t>(inserted_slice.start_offset());
  for (size_t i = inserted_newlines_start; i < inserted_newlines_end; i++) {
    line_offsets[i] += inserted_line_offsets_delta;
  }

  uint32_t content_size = content.size();
  int64_t trailing_line_offsets_delta = static_cast<int64_t>(content_size) - original_content_size;
  for (auto iter = line_offsets.begin() + inserted_newlines_end; iter != line_offsets.end(); ++iter) {
    *iter += trailing_line_offsets_delta;
  }
}